

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

bool __thiscall Imath_2_5::Matrix44<float>::operator==(Matrix44<float> *this,Matrix44<float> *v)

{
  float *pfVar1;
  float fVar2;
  bool local_11;
  Matrix44<float> *v_local;
  Matrix44<float> *this_local;
  
  fVar2 = this->x[0][0];
  local_11 = false;
  if ((fVar2 == v->x[0][0]) && (!NAN(fVar2) && !NAN(v->x[0][0]))) {
    fVar2 = this->x[0][1];
    pfVar1 = v->x[0] + 1;
    local_11 = false;
    if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
      fVar2 = this->x[0][2];
      pfVar1 = v->x[0] + 2;
      local_11 = false;
      if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
        fVar2 = this->x[0][3];
        pfVar1 = v->x[0] + 3;
        local_11 = false;
        if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
          fVar2 = this->x[1][0];
          local_11 = false;
          if ((fVar2 == v->x[1][0]) && (!NAN(fVar2) && !NAN(v->x[1][0]))) {
            fVar2 = this->x[1][1];
            pfVar1 = v->x[1] + 1;
            local_11 = false;
            if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
              fVar2 = this->x[1][2];
              pfVar1 = v->x[1] + 2;
              local_11 = false;
              if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                fVar2 = this->x[1][3];
                pfVar1 = v->x[1] + 3;
                local_11 = false;
                if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                  fVar2 = this->x[2][0];
                  local_11 = false;
                  if ((fVar2 == v->x[2][0]) && (!NAN(fVar2) && !NAN(v->x[2][0]))) {
                    fVar2 = this->x[2][1];
                    pfVar1 = v->x[2] + 1;
                    local_11 = false;
                    if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                      fVar2 = this->x[2][2];
                      pfVar1 = v->x[2] + 2;
                      local_11 = false;
                      if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                        fVar2 = this->x[2][3];
                        pfVar1 = v->x[2] + 3;
                        local_11 = false;
                        if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                          fVar2 = this->x[3][0];
                          local_11 = false;
                          if ((fVar2 == v->x[3][0]) && (!NAN(fVar2) && !NAN(v->x[3][0]))) {
                            fVar2 = this->x[3][1];
                            pfVar1 = v->x[3] + 1;
                            local_11 = false;
                            if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                              fVar2 = this->x[3][2];
                              pfVar1 = v->x[3] + 2;
                              local_11 = false;
                              if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                                local_11 = this->x[3][3] == v->x[3][3];
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool
Matrix44<T>::operator == (const Matrix44 &v) const
{
    return x[0][0] == v.x[0][0] &&
           x[0][1] == v.x[0][1] &&
           x[0][2] == v.x[0][2] &&
           x[0][3] == v.x[0][3] &&
           x[1][0] == v.x[1][0] &&
           x[1][1] == v.x[1][1] &&
           x[1][2] == v.x[1][2] &&
           x[1][3] == v.x[1][3] &&
           x[2][0] == v.x[2][0] &&
           x[2][1] == v.x[2][1] &&
           x[2][2] == v.x[2][2] &&
           x[2][3] == v.x[2][3] &&
           x[3][0] == v.x[3][0] &&
           x[3][1] == v.x[3][1] &&
           x[3][2] == v.x[3][2] &&
           x[3][3] == v.x[3][3];
}